

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericProperty.h
# Opt level: O1

bool SetGenericProperty<std::__cxx11::string>
               (map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *list,char *szName,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  uint uVar3;
  uint uVar4;
  size_t sVar5;
  _Base_ptr p_Var6;
  uint uVar7;
  _Base_ptr p_Var8;
  bool bVar9;
  undefined1 local_50 [8];
  _Alloc_hider local_48;
  char local_38 [16];
  
  if (szName == (char *)0x0) {
    __assert_fail("nullptr != szName",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/include/assimp/GenericProperty.h"
                  ,0x39,
                  "bool SetGenericProperty(std::map<unsigned int, T> &, const char *, const T &) [T = std::basic_string<char>]"
                 );
  }
  sVar5 = strlen(szName);
  uVar4 = (uint)sVar5;
  uVar7 = 0;
  if (3 < uVar4) {
    uVar3 = uVar4 >> 2;
    uVar7 = 0;
    do {
      uVar7 = (*(ushort *)szName + uVar7) * 0x10000 ^
              ((uint)(byte)*(ushort *)((long)szName + 2) << 0xb |
              (uint)*(byte *)((long)szName + 3) << 0x13) ^ *(ushort *)szName + uVar7;
      szName = (char *)((long)szName + 4);
      uVar7 = (uVar7 >> 0xb) + uVar7;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  switch(uVar4 & 3) {
  case 0:
    goto switchD_001391eb_caseD_0;
  case 1:
    uVar7 = uVar7 + (int)(char)*(ushort *)szName;
    uVar4 = uVar7 * 0x400 ^ uVar7;
    uVar7 = uVar4 >> 1;
    break;
  case 2:
    uVar7 = (*(ushort *)szName + uVar7) * 0x800 ^ *(ushort *)szName + uVar7;
    uVar7 = (uVar7 >> 0x11) + uVar7;
    goto switchD_001391eb_caseD_0;
  case 3:
    uVar4 = (*(ushort *)szName + uVar7) * 0x10000 ^
            (int)(char)*(ushort *)((long)szName + 2) << 0x12 ^ *(ushort *)szName + uVar7;
    uVar7 = uVar4 >> 0xb;
  }
  uVar7 = uVar7 + uVar4;
switchD_001391eb_caseD_0:
  uVar7 = uVar7 * 8 ^ uVar7;
  uVar7 = (uVar7 >> 5) + uVar7;
  uVar7 = uVar7 * 0x10 ^ uVar7;
  uVar7 = (uVar7 >> 0x11) + uVar7;
  uVar7 = uVar7 * 0x2000000 ^ uVar7;
  local_50._0_4_ = (uVar7 >> 6) + uVar7;
  p_Var1 = &(list->_M_t)._M_impl.super__Rb_tree_header;
  p_Var8 = (list->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var6 = &p_Var1->_M_header;
  for (; p_Var8 != (_Base_ptr)0x0; p_Var8 = (&p_Var8->_M_left)[bVar9]) {
    bVar9 = p_Var8[1]._M_color < (uint)local_50._0_4_;
    if (!bVar9) {
      p_Var6 = p_Var8;
    }
  }
  p_Var8 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var6 != p_Var1) &&
     (p_Var8 = p_Var6, (uint)local_50._0_4_ < p_Var6[1]._M_color)) {
    p_Var8 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var8 == p_Var1) {
    pcVar2 = (value->_M_dataplus)._M_p;
    local_48._M_p = local_38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,pcVar2,pcVar2 + value->_M_string_length);
    std::
    _Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::__cxx11::string>,std::_Select1st<std::pair<unsigned_int_const,std::__cxx11::string>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>>
    ::_M_emplace_unique<std::pair<unsigned_int,std::__cxx11::string>>
              ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::__cxx11::string>,std::_Select1st<std::pair<unsigned_int_const,std::__cxx11::string>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>>
                *)list,(pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_50);
    if (local_48._M_p != local_38) {
      operator_delete(local_48._M_p);
    }
  }
  else {
    std::__cxx11::string::_M_assign((string *)&p_Var8[1]._M_parent);
  }
  return (_Rb_tree_header *)p_Var8 != p_Var1;
}

Assistant:

inline
bool SetGenericProperty(std::map< unsigned int, T >& list,
        const char* szName, const T& value) {
    ai_assert(nullptr != szName);
    const uint32_t hash = SuperFastHash(szName);

    typename std::map<unsigned int, T>::iterator it = list.find(hash);
    if (it == list.end())   {
        list.insert(std::pair<unsigned int, T>( hash, value ));
        return false;
    }
    (*it).second = value;

    return true;
}